

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Mish_x86_fma::forward_inplace(Mish_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float __x;
  undefined1 auVar1 [32];
  int iVar2;
  undefined1 auVar3 [32];
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  long lVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float fStack_40;
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar8 = 0;
    do {
      auVar77._8_4_ = 0x3f000000;
      auVar77._0_8_ = 0x3f0000003f000000;
      auVar67._8_4_ = 0x3d2aa9c1;
      auVar67._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar18._8_4_ = 0x3c088908;
      auVar18._0_8_ = 0x3c0889083c088908;
      auVar48._8_4_ = 0x3f800000;
      auVar48._0_8_ = 0x3f8000003f800000;
      auVar77._12_4_ = 0x3f000000;
      auVar67._12_4_ = 0x3d2aa9c1;
      auVar18._12_4_ = 0x3c088908;
      auVar48._12_4_ = 0x3f800000;
      auVar77._16_4_ = 0x3f000000;
      auVar67._16_4_ = 0x3d2aa9c1;
      auVar18._16_4_ = 0x3c088908;
      auVar48._16_4_ = 0x3f800000;
      auVar77._20_4_ = 0x3f000000;
      auVar67._20_4_ = 0x3d2aa9c1;
      auVar18._20_4_ = 0x3c088908;
      auVar48._20_4_ = 0x3f800000;
      auVar77._24_4_ = 0x3f000000;
      auVar67._24_4_ = 0x3d2aa9c1;
      auVar18._24_4_ = 0x3c088908;
      auVar48._24_4_ = 0x3f800000;
      auVar77._28_4_ = 0x3f000000;
      auVar67._28_4_ = 0x3d2aa9c1;
      auVar18._28_4_ = 0x3c088908;
      auVar48._28_4_ = 0x3f800000;
      pauVar9 = (undefined1 (*) [32])
                (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar7 < 8) {
        uVar5 = 0;
      }
      else {
        iVar4 = 7;
        do {
          auVar1 = *pauVar9;
          auVar85._8_4_ = 0x42b0c0a5;
          auVar85._0_8_ = 0x42b0c0a542b0c0a5;
          auVar85._12_4_ = 0x42b0c0a5;
          auVar85._16_4_ = 0x42b0c0a5;
          auVar85._20_4_ = 0x42b0c0a5;
          auVar85._24_4_ = 0x42b0c0a5;
          auVar85._28_4_ = 0x42b0c0a5;
          auVar19 = vminps_avx(auVar85,auVar1);
          auVar89._8_4_ = 0xc2b0c0a5;
          auVar89._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar89._12_4_ = 0xc2b0c0a5;
          auVar89._16_4_ = 0xc2b0c0a5;
          auVar89._20_4_ = 0xc2b0c0a5;
          auVar89._24_4_ = 0xc2b0c0a5;
          auVar89._28_4_ = 0xc2b0c0a5;
          auVar20 = vmaxps_avx(auVar89,auVar19);
          auVar91._8_4_ = 0x3fb8aa3b;
          auVar91._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar91._12_4_ = 0x3fb8aa3b;
          auVar91._16_4_ = 0x3fb8aa3b;
          auVar91._20_4_ = 0x3fb8aa3b;
          auVar91._24_4_ = 0x3fb8aa3b;
          auVar91._28_4_ = 0x3fb8aa3b;
          auVar14 = vfmadd213ps_fma(auVar91,auVar20,auVar77);
          auVar3 = vroundps_avx(ZEXT1632(auVar14),1);
          auVar19 = vcmpps_avx(ZEXT1632(auVar14),auVar3,1);
          auVar19 = vandps_avx(auVar19,auVar48);
          auVar19 = vsubps_avx(auVar3,auVar19);
          auVar86._8_4_ = 0x3f318000;
          auVar86._0_8_ = 0x3f3180003f318000;
          auVar86._12_4_ = 0x3f318000;
          auVar86._16_4_ = 0x3f318000;
          auVar86._20_4_ = 0x3f318000;
          auVar86._24_4_ = 0x3f318000;
          auVar86._28_4_ = 0x3f318000;
          auVar14 = vfmsub231ps_fma(auVar20,auVar19,auVar86);
          auVar78._8_4_ = 0xb95e8083;
          auVar78._0_8_ = 0xb95e8083b95e8083;
          auVar78._12_4_ = 0xb95e8083;
          auVar78._16_4_ = 0xb95e8083;
          auVar78._20_4_ = 0xb95e8083;
          auVar78._24_4_ = 0xb95e8083;
          auVar78._28_4_ = 0xb95e8083;
          auVar23 = vfnmsub231ps_fma(ZEXT1632(auVar14),auVar19,auVar78);
          auVar17 = ZEXT1632(auVar23);
          auVar20._28_4_ = auVar3._28_4_;
          auVar20._0_28_ =
               ZEXT1628(CONCAT412(auVar23._12_4_ * auVar23._12_4_,
                                  CONCAT48(auVar23._8_4_ * auVar23._8_4_,
                                           CONCAT44(auVar23._4_4_ * auVar23._4_4_,
                                                    auVar23._0_4_ * auVar23._0_4_))));
          auVar80._8_4_ = 0x39506967;
          auVar80._0_8_ = 0x3950696739506967;
          auVar80._12_4_ = 0x39506967;
          auVar80._16_4_ = 0x39506967;
          auVar80._20_4_ = 0x39506967;
          auVar80._24_4_ = 0x39506967;
          auVar80._28_4_ = 0x39506967;
          auVar93._8_4_ = 0x3ab743ce;
          auVar93._0_8_ = 0x3ab743ce3ab743ce;
          auVar93._12_4_ = 0x3ab743ce;
          auVar93._16_4_ = 0x3ab743ce;
          auVar93._20_4_ = 0x3ab743ce;
          auVar93._24_4_ = 0x3ab743ce;
          auVar93._28_4_ = 0x3ab743ce;
          auVar14 = vfmadd213ps_fma(auVar80,auVar17,auVar93);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar17,auVar18);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar17,auVar67);
          auVar95._8_4_ = 0x3e2aaaaa;
          auVar95._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar95._12_4_ = 0x3e2aaaaa;
          auVar95._16_4_ = 0x3e2aaaaa;
          auVar95._20_4_ = 0x3e2aaaaa;
          auVar95._24_4_ = 0x3e2aaaaa;
          auVar95._28_4_ = 0x3e2aaaaa;
          auVar18 = ZEXT1632(auVar23);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar18,auVar95);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar18,auVar77);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar20,auVar18);
          auVar41._0_4_ = auVar14._0_4_ + 1.0;
          auVar41._4_4_ = auVar14._4_4_ + 1.0;
          auVar41._8_4_ = auVar14._8_4_ + 1.0;
          auVar41._12_4_ = auVar14._12_4_ + 1.0;
          auVar41._16_4_ = 0x3f800000;
          auVar41._20_4_ = 0x3f800000;
          auVar41._24_4_ = 0x3f800000;
          auVar41._28_4_ = 0x3f800000;
          auVar14._0_4_ = (int)auVar19._0_4_;
          auVar14._4_4_ = (int)auVar19._4_4_;
          auVar14._8_4_ = (int)auVar19._8_4_;
          auVar14._12_4_ = (int)auVar19._12_4_;
          auVar17._16_4_ = (int)auVar19._16_4_;
          auVar17._0_16_ = auVar14;
          auVar17._20_4_ = (int)auVar19._20_4_;
          auVar17._24_4_ = (int)auVar19._24_4_;
          auVar17._28_4_ = (int)auVar19._28_4_;
          auVar23 = vpslld_avx(auVar14,0x17);
          auVar14 = vpslld_avx(auVar17._16_16_,0x17);
          auVar82._8_4_ = 0x3f800000;
          auVar82._0_8_ = 0x3f8000003f800000;
          auVar82._12_4_ = 0x3f800000;
          auVar14 = vpaddd_avx(auVar82,auVar14);
          auVar23 = vpaddd_avx(auVar82,auVar23);
          auVar19._16_16_ = auVar14;
          auVar19._0_16_ = auVar23;
          auVar37 = vfmadd213ps_fma(auVar19,auVar41,auVar48);
          auVar28._8_4_ = 0x800000;
          auVar28._0_8_ = 0x80000000800000;
          auVar28._12_4_ = 0x800000;
          auVar28._16_4_ = 0x800000;
          auVar28._20_4_ = 0x800000;
          auVar28._24_4_ = 0x800000;
          auVar28._28_4_ = 0x800000;
          auVar18 = vmaxps_avx(ZEXT1632(auVar37),auVar28);
          auVar23 = vpsrld_avx(auVar18._0_16_,0x17);
          auVar14 = vpsrld_avx(auVar18._16_16_,0x17);
          auVar53._8_4_ = 0x807fffff;
          auVar53._0_8_ = 0x807fffff807fffff;
          auVar53._12_4_ = 0x807fffff;
          auVar53._16_4_ = 0x807fffff;
          auVar53._20_4_ = 0x807fffff;
          auVar53._24_4_ = 0x807fffff;
          auVar53._28_4_ = 0x807fffff;
          auVar18 = vandps_avx(auVar18,auVar53);
          auVar19 = vorps_avx(auVar77,auVar18);
          auVar54._8_4_ = 0x3f3504f3;
          auVar54._0_8_ = 0x3f3504f33f3504f3;
          auVar54._12_4_ = 0x3f3504f3;
          auVar54._16_4_ = 0x3f3504f3;
          auVar54._20_4_ = 0x3f3504f3;
          auVar54._24_4_ = 0x3f3504f3;
          auVar54._28_4_ = 0x3f3504f3;
          auVar67 = vcmpps_avx(auVar54,auVar19,2);
          auVar18 = vandnps_avx(auVar67,auVar19);
          auVar81._8_4_ = 0xc0000000;
          auVar81._0_8_ = 0xc0000000c0000000;
          auVar81._12_4_ = 0xc0000000;
          auVar81._16_4_ = 0xc0000000;
          auVar81._20_4_ = 0xc0000000;
          auVar81._24_4_ = 0xc0000000;
          auVar81._28_4_ = 0xc0000000;
          auVar29._0_4_ = auVar19._0_4_ + -1.0 + auVar18._0_4_;
          auVar29._4_4_ = auVar19._4_4_ + -1.0 + auVar18._4_4_;
          auVar29._8_4_ = auVar19._8_4_ + -1.0 + auVar18._8_4_;
          auVar29._12_4_ = auVar19._12_4_ + -1.0 + auVar18._12_4_;
          auVar29._16_4_ = auVar19._16_4_ + -1.0 + auVar18._16_4_;
          auVar29._20_4_ = auVar19._20_4_ + -1.0 + auVar18._20_4_;
          auVar29._24_4_ = auVar19._24_4_ + -1.0 + auVar18._24_4_;
          auVar29._28_4_ = auVar19._28_4_ + -1.0 + auVar18._28_4_;
          auVar14 = vpsubd_avx(auVar14,auVar67._16_16_);
          auVar57._8_4_ = 0xffffff81;
          auVar57._0_8_ = 0xffffff81ffffff81;
          auVar57._12_4_ = 0xffffff81;
          auVar14 = vpaddd_avx(auVar14,auVar57);
          auVar23 = vpsubd_avx(auVar23,auVar67._0_16_);
          auVar23 = vpaddd_avx(auVar23,auVar57);
          auVar42._16_16_ = auVar14;
          auVar42._0_16_ = auVar23;
          auVar49._0_4_ = auVar29._0_4_ * auVar29._0_4_;
          auVar49._4_4_ = auVar29._4_4_ * auVar29._4_4_;
          auVar49._8_4_ = auVar29._8_4_ * auVar29._8_4_;
          auVar49._12_4_ = auVar29._12_4_ * auVar29._12_4_;
          auVar49._16_4_ = auVar29._16_4_ * auVar29._16_4_;
          auVar49._20_4_ = auVar29._20_4_ * auVar29._20_4_;
          auVar49._24_4_ = auVar29._24_4_ * auVar29._24_4_;
          auVar49._28_4_ = 0;
          auVar55._8_4_ = 0x3d9021bb;
          auVar55._0_8_ = 0x3d9021bb3d9021bb;
          auVar55._12_4_ = 0x3d9021bb;
          auVar55._16_4_ = 0x3d9021bb;
          auVar55._20_4_ = 0x3d9021bb;
          auVar55._24_4_ = 0x3d9021bb;
          auVar55._28_4_ = 0x3d9021bb;
          auVar68._8_4_ = 0xbdebd1b8;
          auVar68._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar68._12_4_ = 0xbdebd1b8;
          auVar68._16_4_ = 0xbdebd1b8;
          auVar68._20_4_ = 0xbdebd1b8;
          auVar68._24_4_ = 0xbdebd1b8;
          auVar68._28_4_ = 0xbdebd1b8;
          auVar14 = vfmadd213ps_fma(auVar55,auVar29,auVar68);
          auVar69._8_4_ = 0x3def251a;
          auVar69._0_8_ = 0x3def251a3def251a;
          auVar69._12_4_ = 0x3def251a;
          auVar69._16_4_ = 0x3def251a;
          auVar69._20_4_ = 0x3def251a;
          auVar69._24_4_ = 0x3def251a;
          auVar69._28_4_ = 0x3def251a;
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar29,auVar69);
          auVar70._8_4_ = 0xbdfe5d4f;
          auVar70._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar70._12_4_ = 0xbdfe5d4f;
          auVar70._16_4_ = 0xbdfe5d4f;
          auVar70._20_4_ = 0xbdfe5d4f;
          auVar70._24_4_ = 0xbdfe5d4f;
          auVar70._28_4_ = 0xbdfe5d4f;
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar29,auVar70);
          auVar71._8_4_ = 0x3e11e9bf;
          auVar71._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar71._12_4_ = 0x3e11e9bf;
          auVar71._16_4_ = 0x3e11e9bf;
          auVar71._20_4_ = 0x3e11e9bf;
          auVar71._24_4_ = 0x3e11e9bf;
          auVar71._28_4_ = 0x3e11e9bf;
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar29,auVar71);
          auVar72._8_4_ = 0xbe2aae50;
          auVar72._0_8_ = 0xbe2aae50be2aae50;
          auVar72._12_4_ = 0xbe2aae50;
          auVar72._16_4_ = 0xbe2aae50;
          auVar72._20_4_ = 0xbe2aae50;
          auVar72._24_4_ = 0xbe2aae50;
          auVar72._28_4_ = 0xbe2aae50;
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar29,auVar72);
          auVar73._8_4_ = 0x3e4cceac;
          auVar73._0_8_ = 0x3e4cceac3e4cceac;
          auVar73._12_4_ = 0x3e4cceac;
          auVar73._16_4_ = 0x3e4cceac;
          auVar73._20_4_ = 0x3e4cceac;
          auVar73._24_4_ = 0x3e4cceac;
          auVar73._28_4_ = 0x3e4cceac;
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar29,auVar73);
          auVar74._8_4_ = 0xbe7ffffc;
          auVar74._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar74._12_4_ = 0xbe7ffffc;
          auVar74._16_4_ = 0xbe7ffffc;
          auVar74._20_4_ = 0xbe7ffffc;
          auVar74._24_4_ = 0xbe7ffffc;
          auVar74._28_4_ = 0xbe7ffffc;
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar29,auVar74);
          auVar75._8_4_ = 0x3eaaaaaa;
          auVar75._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar75._12_4_ = 0x3eaaaaaa;
          auVar75._16_4_ = 0x3eaaaaaa;
          auVar75._20_4_ = 0x3eaaaaaa;
          auVar75._24_4_ = 0x3eaaaaaa;
          auVar75._28_4_ = 0x3eaaaaaa;
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar29,auVar75);
          auVar56._0_4_ = auVar49._0_4_ * auVar29._0_4_ * auVar14._0_4_;
          auVar56._4_4_ = auVar49._4_4_ * auVar29._4_4_ * auVar14._4_4_;
          auVar56._8_4_ = auVar49._8_4_ * auVar29._8_4_ * auVar14._8_4_;
          auVar56._12_4_ = auVar49._12_4_ * auVar29._12_4_ * auVar14._12_4_;
          auVar56._16_4_ = auVar49._16_4_ * auVar29._16_4_ * 0.0;
          auVar56._20_4_ = auVar49._20_4_ * auVar29._20_4_ * 0.0;
          auVar56._24_4_ = auVar49._24_4_ * auVar29._24_4_ * 0.0;
          auVar56._28_4_ = 0;
          auVar67._8_4_ = 0x3d2aa9c1;
          auVar67._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar67._12_4_ = 0x3d2aa9c1;
          auVar67._16_4_ = 0x3d2aa9c1;
          auVar67._20_4_ = 0x3d2aa9c1;
          auVar67._24_4_ = 0x3d2aa9c1;
          auVar67._28_4_ = 0x3d2aa9c1;
          auVar20 = vcvtdq2ps_avx(auVar42);
          auVar14 = vfmadd231ps_fma(auVar56,auVar20,auVar78);
          auVar14 = vfmsub231ps_fma(ZEXT1632(auVar14),auVar77,auVar49);
          auVar19 = vcmpps_avx(ZEXT1632(auVar37),_DAT_005a71a0,2);
          auVar3 = vsubps_avx(ZEXT1632(auVar14),auVar29);
          auVar18._8_4_ = 0x3c088908;
          auVar18._0_8_ = 0x3c0889083c088908;
          auVar18._12_4_ = 0x3c088908;
          auVar18._16_4_ = 0x3c088908;
          auVar18._20_4_ = 0x3c088908;
          auVar18._24_4_ = 0x3c088908;
          auVar18._28_4_ = 0x3c088908;
          auVar14 = vfmsub231ps_fma(auVar3,auVar86,auVar20);
          auVar30._0_4_ = auVar14._0_4_ * -2.0;
          auVar30._4_4_ = auVar14._4_4_ * -2.0;
          auVar30._8_4_ = auVar14._8_4_ * -2.0;
          auVar30._12_4_ = auVar14._12_4_ * -2.0;
          auVar30._16_4_ = 0x80000000;
          auVar30._20_4_ = 0x80000000;
          auVar30._24_4_ = 0x80000000;
          auVar30._28_4_ = 0;
          auVar43._8_4_ = 0x7fffffff;
          auVar43._0_8_ = 0x7fffffff7fffffff;
          auVar43._12_4_ = 0x7fffffff;
          auVar43._16_4_ = 0x7fffffff;
          auVar43._20_4_ = 0x7fffffff;
          auVar43._24_4_ = 0x7fffffff;
          auVar43._28_4_ = 0x7fffffff;
          auVar19 = vblendvps_avx(auVar30,auVar43,auVar19);
          auVar31._8_4_ = 0x42b0c0a5;
          auVar31._0_8_ = 0x42b0c0a542b0c0a5;
          auVar31._12_4_ = 0x42b0c0a5;
          auVar31._16_4_ = 0x42b0c0a5;
          auVar31._20_4_ = 0x42b0c0a5;
          auVar31._24_4_ = 0x42b0c0a5;
          auVar31._28_4_ = 0x42b0c0a5;
          auVar19 = vminps_avx(auVar19,auVar31);
          auVar20 = vmaxps_avx(auVar89,auVar19);
          auVar14 = vfmadd213ps_fma(auVar91,auVar20,auVar77);
          auVar3 = vroundps_avx(ZEXT1632(auVar14),1);
          auVar19 = vcmpps_avx(ZEXT1632(auVar14),auVar3,1);
          auVar19 = vandps_avx(auVar19,auVar48);
          auVar19 = vsubps_avx(auVar3,auVar19);
          auVar14 = vfmsub231ps_fma(auVar20,auVar19,auVar86);
          auVar23 = vfnmsub231ps_fma(ZEXT1632(auVar14),auVar19,auVar78);
          auVar20 = ZEXT1632(auVar23);
          auVar3._28_4_ = auVar3._28_4_;
          auVar3._0_28_ =
               ZEXT1628(CONCAT412(auVar23._12_4_ * auVar23._12_4_,
                                  CONCAT48(auVar23._8_4_ * auVar23._8_4_,
                                           CONCAT44(auVar23._4_4_ * auVar23._4_4_,
                                                    auVar23._0_4_ * auVar23._0_4_))));
          auVar50._8_4_ = 0x39506967;
          auVar50._0_8_ = 0x3950696739506967;
          auVar50._12_4_ = 0x39506967;
          auVar50._16_4_ = 0x39506967;
          auVar50._20_4_ = 0x39506967;
          auVar50._24_4_ = 0x39506967;
          auVar50._28_4_ = 0x39506967;
          auVar14 = vfmadd213ps_fma(auVar50,auVar20,auVar93);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar20,auVar18);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar20,auVar67);
          auVar20 = ZEXT1632(auVar23);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar20,auVar95);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar20,auVar77);
          auVar37 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar3,auVar20);
          auVar23._0_4_ = (int)auVar19._0_4_;
          auVar23._4_4_ = (int)auVar19._4_4_;
          auVar23._8_4_ = (int)auVar19._8_4_;
          auVar23._12_4_ = (int)auVar19._12_4_;
          auVar21._16_4_ = (int)auVar19._16_4_;
          auVar21._0_16_ = auVar23;
          auVar21._20_4_ = (int)auVar19._20_4_;
          auVar21._24_4_ = (int)auVar19._24_4_;
          auVar21._28_4_ = (int)auVar19._28_4_;
          auVar23 = vpslld_avx(auVar23,0x17);
          auVar14 = vpslld_avx(auVar21._16_16_,0x17);
          auVar14 = vpaddd_avx(auVar82,auVar14);
          auVar23 = vpaddd_avx(auVar82,auVar23);
          auVar22._16_16_ = auVar14;
          auVar22._0_16_ = auVar23;
          auVar32._0_4_ = auVar37._0_4_ + 1.0;
          auVar32._4_4_ = auVar37._4_4_ + 1.0;
          auVar32._8_4_ = auVar37._8_4_ + 1.0;
          auVar32._12_4_ = auVar37._12_4_ + 1.0;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar14 = vfmadd213ps_fma(auVar22,auVar32,auVar48);
          auVar19 = vdivps_avx(auVar48,ZEXT1632(auVar14));
          auVar33._8_4_ = 0xbf800000;
          auVar33._0_8_ = 0xbf800000bf800000;
          auVar33._12_4_ = 0xbf800000;
          auVar33._16_4_ = 0xbf800000;
          auVar33._20_4_ = 0xbf800000;
          auVar33._24_4_ = 0xbf800000;
          auVar33._28_4_ = 0xbf800000;
          auVar14 = vfnmadd213ps_fma(auVar19,auVar81,auVar33);
          local_58 = auVar1._0_4_;
          fStack_54 = auVar1._4_4_;
          fStack_50 = auVar1._8_4_;
          fStack_4c = auVar1._12_4_;
          fStack_48 = auVar1._16_4_;
          fStack_44 = auVar1._20_4_;
          fStack_40 = auVar1._24_4_;
          auVar1._4_4_ = auVar14._4_4_ * fStack_54;
          auVar1._0_4_ = auVar14._0_4_ * local_58;
          auVar1._8_4_ = auVar14._8_4_ * fStack_50;
          auVar1._12_4_ = auVar14._12_4_ * fStack_4c;
          auVar1._16_4_ = fStack_48 * 0.0;
          auVar1._20_4_ = fStack_44 * 0.0;
          auVar1._24_4_ = fStack_40 * 0.0;
          auVar1._28_4_ = 0x3f800000;
          *pauVar9 = auVar1;
          pauVar9 = pauVar9 + 1;
          iVar4 = iVar4 + 8;
          uVar5 = uVar7 & 0xfffffff8;
        } while (iVar4 < (int)uVar7);
      }
      auVar76._8_4_ = 0x3f800000;
      auVar76._0_8_ = 0x3f8000003f800000;
      auVar76._12_4_ = 0x3f800000;
      auVar37._8_4_ = 0x39506967;
      auVar37._0_8_ = 0x3950696739506967;
      auVar37._12_4_ = 0x39506967;
      auVar58._8_4_ = 0x3c088908;
      auVar58._0_8_ = 0x3c0889083c088908;
      auVar58._12_4_ = 0x3c088908;
      uVar6 = uVar5 | 3;
      while ((int)uVar6 < (int)uVar7) {
        auVar14 = *(undefined1 (*) [16])*pauVar9;
        auVar83._8_4_ = 0x42b0c0a5;
        auVar83._0_8_ = 0x42b0c0a542b0c0a5;
        auVar83._12_4_ = 0x42b0c0a5;
        auVar23 = vminps_avx(auVar83,auVar14);
        auVar84._8_4_ = 0xc2b0c0a5;
        auVar84._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar84._12_4_ = 0xc2b0c0a5;
        auVar82 = vmaxps_avx(auVar84,auVar23);
        auVar94._8_4_ = 0x3fb8aa3b;
        auVar94._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar94._12_4_ = 0x3fb8aa3b;
        auVar12._8_4_ = 0x3f000000;
        auVar12._0_8_ = 0x3f0000003f000000;
        auVar12._12_4_ = 0x3f000000;
        auVar23 = vfmadd213ps_fma(auVar94,auVar82,auVar12);
        auVar34._0_4_ = (int)auVar23._0_4_;
        auVar34._4_4_ = (int)auVar23._4_4_;
        auVar34._8_4_ = (int)auVar23._8_4_;
        auVar34._12_4_ = (int)auVar23._12_4_;
        auVar57 = vcvtdq2ps_avx(auVar34);
        auVar23 = vcmpps_avx(auVar23,auVar57,1);
        auVar23 = vandps_avx(auVar23,auVar76);
        auVar23 = vsubps_avx(auVar57,auVar23);
        auVar92._8_4_ = 0x3f318000;
        auVar92._0_8_ = 0x3f3180003f318000;
        auVar92._12_4_ = 0x3f318000;
        auVar57 = vfmsub231ps_fma(auVar82,auVar23,auVar92);
        auVar87._8_4_ = 0xb95e8083;
        auVar87._0_8_ = 0xb95e8083b95e8083;
        auVar87._12_4_ = 0xb95e8083;
        auVar57 = vfnmsub231ps_fma(auVar57,auVar23,auVar87);
        auVar35._0_4_ = auVar57._0_4_ * auVar57._0_4_;
        auVar35._4_4_ = auVar57._4_4_ * auVar57._4_4_;
        auVar35._8_4_ = auVar57._8_4_ * auVar57._8_4_;
        auVar35._12_4_ = auVar57._12_4_ * auVar57._12_4_;
        auVar79._8_4_ = 0x3ab743ce;
        auVar79._0_8_ = 0x3ab743ce3ab743ce;
        auVar79._12_4_ = 0x3ab743ce;
        auVar37 = vfmadd213ps_fma(auVar37,auVar57,auVar79);
        auVar37 = vfmadd213ps_fma(auVar37,auVar57,auVar58);
        auVar90._8_4_ = 0x3d2aa9c1;
        auVar90._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar90._12_4_ = 0x3d2aa9c1;
        auVar37 = vfmadd213ps_fma(auVar37,auVar57,auVar90);
        auVar88._8_4_ = 0x3e2aaaaa;
        auVar88._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar88._12_4_ = 0x3e2aaaaa;
        auVar37 = vfmadd213ps_fma(auVar37,auVar57,auVar88);
        auVar37 = vfmadd213ps_fma(auVar37,auVar57,auVar12);
        auVar37 = vfmadd213ps_fma(auVar37,auVar35,auVar57);
        auVar36._0_4_ = auVar37._0_4_ + 1.0;
        auVar36._4_4_ = auVar37._4_4_ + 1.0;
        auVar36._8_4_ = auVar37._8_4_ + 1.0;
        auVar36._12_4_ = auVar37._12_4_ + 1.0;
        auVar15._0_4_ = (int)auVar23._0_4_;
        auVar15._4_4_ = (int)auVar23._4_4_;
        auVar15._8_4_ = (int)auVar23._8_4_;
        auVar15._12_4_ = (int)auVar23._12_4_;
        auVar23 = vpslld_avx(auVar15,0x17);
        auVar23 = vpaddd_avx(auVar23,auVar76);
        auVar13 = vfmadd213ps_fma(auVar23,auVar36,auVar76);
        auVar24._8_4_ = 0x800000;
        auVar24._0_8_ = 0x80000000800000;
        auVar24._12_4_ = 0x800000;
        auVar23 = vmaxps_avx(auVar13,auVar24);
        auVar37 = vpsrld_avx(auVar23,0x17);
        auVar44._8_4_ = 0xffffff82;
        auVar44._0_8_ = 0xffffff82ffffff82;
        auVar44._12_4_ = 0xffffff82;
        auVar37 = vpaddd_avx(auVar37,auVar44);
        auVar45._8_4_ = 0x807fffff;
        auVar45._0_8_ = 0x807fffff807fffff;
        auVar45._12_4_ = 0x807fffff;
        auVar23 = vandps_avx(auVar23,auVar45);
        auVar82 = vorps_avx(auVar23,auVar12);
        auVar57 = vcvtdq2ps_avx(auVar37);
        auVar46._8_4_ = 0x3f3504f3;
        auVar46._0_8_ = 0x3f3504f33f3504f3;
        auVar46._12_4_ = 0x3f3504f3;
        auVar37 = vcmpps_avx(auVar82,auVar46,1);
        auVar23 = vandps_avx(auVar37,auVar82);
        auVar25._0_4_ = auVar82._0_4_ + -1.0 + auVar23._0_4_;
        auVar25._4_4_ = auVar82._4_4_ + -1.0 + auVar23._4_4_;
        auVar25._8_4_ = auVar82._8_4_ + -1.0 + auVar23._8_4_;
        auVar25._12_4_ = auVar82._12_4_ + -1.0 + auVar23._12_4_;
        auVar23 = vandps_avx(auVar37,auVar76);
        auVar57 = vsubps_avx(auVar57,auVar23);
        auVar47._0_4_ = auVar25._0_4_ * auVar25._0_4_;
        auVar47._4_4_ = auVar25._4_4_ * auVar25._4_4_;
        auVar47._8_4_ = auVar25._8_4_ * auVar25._8_4_;
        auVar47._12_4_ = auVar25._12_4_ * auVar25._12_4_;
        auVar51._8_4_ = 0x3d9021bb;
        auVar51._0_8_ = 0x3d9021bb3d9021bb;
        auVar51._12_4_ = 0x3d9021bb;
        auVar59._8_4_ = 0xbdebd1b8;
        auVar59._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar59._12_4_ = 0xbdebd1b8;
        auVar23 = vfmadd213ps_fma(auVar51,auVar25,auVar59);
        auVar60._8_4_ = 0x3def251a;
        auVar60._0_8_ = 0x3def251a3def251a;
        auVar60._12_4_ = 0x3def251a;
        auVar23 = vfmadd213ps_fma(auVar23,auVar25,auVar60);
        auVar61._8_4_ = 0xbdfe5d4f;
        auVar61._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar61._12_4_ = 0xbdfe5d4f;
        auVar23 = vfmadd213ps_fma(auVar23,auVar25,auVar61);
        auVar62._8_4_ = 0x3e11e9bf;
        auVar62._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar62._12_4_ = 0x3e11e9bf;
        auVar23 = vfmadd213ps_fma(auVar23,auVar25,auVar62);
        auVar63._8_4_ = 0xbe2aae50;
        auVar63._0_8_ = 0xbe2aae50be2aae50;
        auVar63._12_4_ = 0xbe2aae50;
        auVar23 = vfmadd213ps_fma(auVar23,auVar25,auVar63);
        auVar64._8_4_ = 0x3e4cceac;
        auVar64._0_8_ = 0x3e4cceac3e4cceac;
        auVar64._12_4_ = 0x3e4cceac;
        auVar23 = vfmadd213ps_fma(auVar23,auVar25,auVar64);
        auVar65._8_4_ = 0xbe7ffffc;
        auVar65._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar65._12_4_ = 0xbe7ffffc;
        auVar23 = vfmadd213ps_fma(auVar23,auVar25,auVar65);
        auVar66._8_4_ = 0x3eaaaaaa;
        auVar66._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar66._12_4_ = 0x3eaaaaaa;
        auVar23 = vfmadd213ps_fma(auVar23,auVar25,auVar66);
        auVar52._0_4_ = auVar47._0_4_ * auVar25._0_4_ * auVar23._0_4_;
        auVar52._4_4_ = auVar47._4_4_ * auVar25._4_4_ * auVar23._4_4_;
        auVar52._8_4_ = auVar47._8_4_ * auVar25._8_4_ * auVar23._8_4_;
        auVar52._12_4_ = auVar47._12_4_ * auVar25._12_4_ * auVar23._12_4_;
        auVar58._8_4_ = 0x3c088908;
        auVar58._0_8_ = 0x3c0889083c088908;
        auVar58._12_4_ = 0x3c088908;
        auVar23 = vfmadd231ps_fma(auVar52,auVar57,auVar87);
        auVar37 = vfmsub231ps_fma(auVar23,auVar12,auVar47);
        auVar23 = vcmpps_avx(auVar13,_DAT_005a3030,2);
        auVar82 = vsubps_avx(auVar37,auVar25);
        auVar37._8_4_ = 0x39506967;
        auVar37._0_8_ = 0x3950696739506967;
        auVar37._12_4_ = 0x39506967;
        auVar57 = vfnmadd231ps_fma(auVar82,auVar92,auVar57);
        auVar26._0_4_ = auVar57._0_4_ + auVar57._0_4_;
        auVar26._4_4_ = auVar57._4_4_ + auVar57._4_4_;
        auVar26._8_4_ = auVar57._8_4_ + auVar57._8_4_;
        auVar26._12_4_ = auVar57._12_4_ + auVar57._12_4_;
        auVar38._8_4_ = 0x7fffffff;
        auVar38._0_8_ = 0x7fffffff7fffffff;
        auVar38._12_4_ = 0x7fffffff;
        auVar23 = vblendvps_avx(auVar26,auVar38,auVar23);
        auVar23 = vminps_avx(auVar83,auVar23);
        auVar82 = vmaxps_avx(auVar84,auVar23);
        auVar23 = vfmadd213ps_fma(auVar94,auVar82,auVar12);
        auVar39._0_4_ = (int)auVar23._0_4_;
        auVar39._4_4_ = (int)auVar23._4_4_;
        auVar39._8_4_ = (int)auVar23._8_4_;
        auVar39._12_4_ = (int)auVar23._12_4_;
        auVar57 = vcvtdq2ps_avx(auVar39);
        auVar23 = vcmpps_avx(auVar23,auVar57,1);
        auVar23 = vandps_avx(auVar23,auVar76);
        auVar23 = vsubps_avx(auVar57,auVar23);
        auVar57 = vfmsub231ps_fma(auVar82,auVar23,auVar92);
        auVar82 = vfnmsub231ps_fma(auVar57,auVar23,auVar87);
        auVar40._0_4_ = auVar82._0_4_ * auVar82._0_4_;
        auVar40._4_4_ = auVar82._4_4_ * auVar82._4_4_;
        auVar40._8_4_ = auVar82._8_4_ * auVar82._8_4_;
        auVar40._12_4_ = auVar82._12_4_ * auVar82._12_4_;
        auVar57 = vfmadd213ps_fma(auVar37,auVar82,auVar79);
        auVar57 = vfmadd213ps_fma(auVar57,auVar82,auVar58);
        auVar57 = vfmadd213ps_fma(auVar57,auVar82,auVar90);
        auVar57 = vfmadd213ps_fma(auVar57,auVar82,auVar88);
        auVar57 = vfmadd213ps_fma(auVar57,auVar82,auVar12);
        auVar57 = vfmadd213ps_fma(auVar57,auVar40,auVar82);
        auVar16._0_4_ = auVar57._0_4_ + 1.0;
        auVar16._4_4_ = auVar57._4_4_ + 1.0;
        auVar16._8_4_ = auVar57._8_4_ + 1.0;
        auVar16._12_4_ = auVar57._12_4_ + 1.0;
        auVar27._0_4_ = (int)auVar23._0_4_;
        auVar27._4_4_ = (int)auVar23._4_4_;
        auVar27._8_4_ = (int)auVar23._8_4_;
        auVar27._12_4_ = (int)auVar23._12_4_;
        auVar23 = vpslld_avx(auVar27,0x17);
        auVar23 = vpaddd_avx(auVar23,auVar76);
        auVar23 = vfmadd213ps_fma(auVar23,auVar16,auVar76);
        auVar13._8_4_ = 0x40000000;
        auVar13._0_8_ = 0x4000000040000000;
        auVar13._12_4_ = 0x40000000;
        auVar23 = vdivps_avx(auVar13,auVar23);
        auVar14 = vfmsub213ps_fma(auVar23,auVar14,auVar14);
        *(undefined1 (*) [16])*pauVar9 = auVar14;
        pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
        uVar6 = uVar5 + 7;
        uVar5 = uVar5 + 4;
      }
      if (uVar7 - uVar5 != 0 && (int)uVar5 <= (int)uVar7) {
        lVar10 = 0;
        do {
          __x = *(float *)(*pauVar9 + lVar10 * 4);
          fVar11 = expf(__x);
          fVar11 = logf(fVar11 + 1.0);
          fVar11 = tanhf(fVar11);
          *(float *)(*pauVar9 + lVar10 * 4) = fVar11 * __x;
          lVar10 = lVar10 + 1;
        } while (uVar7 - uVar5 != (int)lVar10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar2);
  }
  return 0;
}

Assistant:

int Mish_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = mish_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}